

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  size_t sVar1;
  size_t s;
  bool bVar2;
  string local_42e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_42c0;
  cmAlphaNum local_42a0;
  cmAlphaNum local_4270;
  ifstream fin;
  size_t local_4238;
  byte abStack_4220 [488];
  char buffer [16384];
  
  std::ifstream::ifstream(&fin,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(_fin + -0x18)] & 5) == 0) {
    do {
      bVar2 = size == 0;
      if (bVar2) goto LAB_00378a8d;
      s = 0x4000;
      if (size < 0x4000) {
        s = size;
      }
      std::istream::read((char *)&fin,(long)buffer);
      if (local_4238 != s) {
        local_42a0.View_._M_len = 0xf;
        local_42a0.View_._M_str = "Error reading \"";
        local_4270.View_._M_len = strlen(file);
        local_4270.View_._M_str = file;
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmStrCat<char[4],std::__cxx11::string>
                  (&local_42c0,&local_42a0,&local_4270,(char (*) [4])0x62d153,&local_42e0);
        goto LAB_00378a67;
      }
      sVar1 = archive_write_data(this->Archive,buffer,s);
      size = size - s;
    } while (sVar1 == s);
    local_42a0.View_._M_len = 0x14;
    local_42a0.View_._M_str = "archive_write_data: ";
    cm_archive_error_string_abi_cxx11_(&local_42e0,this->Archive);
    local_4270.View_._M_len = local_42e0._M_string_length;
    local_4270.View_._M_str = local_42e0._M_dataplus._M_p;
    cmStrCat<>(&local_42c0,&local_42a0,&local_4270);
LAB_00378a67:
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_42c0);
    std::__cxx11::string::~string((string *)&local_42c0);
    std::__cxx11::string::~string((string *)&local_42e0);
  }
  else {
    buffer[0] = '\x0f';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer._8_8_ = anon_var_dwarf_129d966;
    local_42a0.View_._M_len = strlen(file);
    local_42a0.View_._M_str = file;
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char[4],std::__cxx11::string>
              ((string *)&local_4270,(cmAlphaNum *)buffer,&local_42a0,(char (*) [4])0x62d153,
               &local_42c0);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_4270);
    std::__cxx11::string::~string((string *)&local_4270);
    std::__cxx11::string::~string((string *)&local_42c0);
    bVar2 = false;
  }
LAB_00378a8d:
  std::ifstream::~ifstream(&fin);
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = cmStrCat("Error opening \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    using ssize_type = std::streamsize;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = cmStrCat("archive_write_data: ",
                             cm_archive_error_string(this->Archive));
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = cmStrCat("Error reading \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }
  return true;
}